

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

size_t __thiscall LatencyItem::getNumStacks(LatencyItem *this)

{
  ulong uVar1;
  long lVar2;
  char *in_RDI;
  size_t ret;
  size_t str_size;
  size_t pos;
  size_t local_20;
  ulong local_10;
  
  local_10 = 0;
  uVar1 = std::__cxx11::string::size();
  local_20 = 0;
  while ((local_10 < uVar1 && (lVar2 = std::__cxx11::string::find(in_RDI,0x11a232), lVar2 != -1))) {
    local_10 = lVar2 + 4;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t getNumStacks() const {
        size_t pos = 0;
        size_t str_size = statName.size();
        size_t ret = 0;
        while (pos < str_size) {
            pos = statName.find(" ## ", pos);
            if (pos == std::string::npos) break;
            pos += 4;
            ret++;
        }
        return ret;
    }